

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O2

void trc_apply_level_by_category(int category,int lvl)

{
  long lVar1;
  
  for (lVar1 = 8; lVar1 != 0xd8; lVar1 = lVar1 + 0x10) {
    if ((category == 0) || ((*(uint *)((long)&trc_cfts[0].cft + lVar1) & category) != 0)) {
      *(int *)(*(long *)(&UNK_00194b08 + lVar1) + 0xc) = lvl;
    }
  }
  for (lVar1 = 8; lVar1 != 0x68; lVar1 = lVar1 + 0x10) {
    if ((category == 0) || ((*(uint *)((long)&trc_feats[0].feat + lVar1) & category) != 0)) {
      *(int *)(*(long *)((long)&trc_cfts[0xc].category + lVar1) + 8) = lvl;
    }
  }
  return;
}

Assistant:

static void trc_apply_level_by_category(int category, int lvl)
{
  size_t i;

  for(i = 0; i < ARRAYSIZE(trc_cfts); ++i) {
    if(!category || (trc_cfts[i].category & category))
      trc_cfts[i].cft->log_level = lvl;
  }
  for(i = 0; i < ARRAYSIZE(trc_feats); ++i) {
    if(!category || (trc_feats[i].category & category))
      trc_feats[i].feat->log_level = lvl;
  }
}